

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O2

bool cmSetTargetPropertiesCommand::SetOneTarget
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf)

{
  pointer pbVar1;
  cmTarget *this;
  ulong uVar2;
  uint uVar3;
  
  this = cmMakefile::FindTargetToUse(mf,tname,false);
  if (this != (cmTarget *)0x0) {
    uVar3 = 1;
    while( true ) {
      uVar2 = (ulong)(uVar3 - 1);
      pbVar1 = (propertyPairs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(propertyPairs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar2)
      break;
      cmTarget::SetProperty(this,pbVar1 + uVar2,pbVar1[uVar3]._M_dataplus._M_p);
      cmTarget::CheckProperty
                (this,(propertyPairs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar2,mf);
      uVar3 = uVar3 + 2;
    }
  }
  return this != (cmTarget *)0x0;
}

Assistant:

bool cmSetTargetPropertiesCommand
::SetOneTarget(const std::string& tname,
               std::vector<std::string> &propertyPairs,
               cmMakefile *mf)
{
  if(cmTarget* target = mf->FindTargetToUse(tname))
    {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2)
      {
      target->SetProperty(propertyPairs[k],
                          propertyPairs[k+1].c_str());
      target->CheckProperty(propertyPairs[k], mf);
      }
    }
  // if file is not already in the makefile, then add it
  else
    {
    return false;
    }
  return true;
}